

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

Oop __thiscall
Lodtalk::MethodCompiler::visitAssignmentExpression(MethodCompiler *this,AssignmentExpression *node)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  Node *pNVar3;
  IdentifierExpression *this_01;
  VariableLookupPtr *pVVar4;
  undefined8 extraout_RAX;
  
  pNVar3 = AST::AssignmentExpression::getValue(node);
  (*pNVar3->_vptr_Node[2])(pNVar3,this);
  this_01 = (IdentifierExpression *)AST::AssignmentExpression::getReference(node);
  iVar2 = (*(this_01->super_Node)._vptr_Node[4])(this_01);
  if ((char)iVar2 != '\0') {
    pVVar4 = AST::IdentifierExpression::getVariable(this_01);
    peVar1 = (pVVar4->super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    this_00 = (pVVar4->super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_VariableLookup[7])(peVar1,&this->gen,this->localContext);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return (Oop)&NilObject;
  }
  visitAssignmentExpression();
  if (this_01 != (IdentifierExpression *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Oop MethodCompiler::visitAssignmentExpression(AssignmentExpression *node)
{
    // Generate the value
    auto value = node->getValue();
    value->acceptVisitor(this);

    // Ensure the reference is an identifier expression.
    auto reference = node->getReference();
    if(!reference->isIdentifierExpression())
        LODTALK_UNIMPLEMENTED();

    // Perform the assignment.
    auto identExpr = static_cast<AST::IdentifierExpression*> (reference);
    auto variable = identExpr->getVariable();
    variable->generateStore(gen, localContext);

    return Oop();
}